

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteSwitch<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::string_t(*)(duckdb::string_t,duckdb::string_t)>
               (Vector *left,Vector *right,Vector *result,idx_t count,
               _func_string_t_string_t_string_t *fun)

{
  Vector VVar1;
  Vector VVar2;
  
  VVar1 = *left;
  VVar2 = *right;
  if (((byte)VVar1 ^ 2) == 0 && ((byte)VVar2 ^ 2) == 0) {
    ExecuteConstant<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::string_t(*)(duckdb::string_t,duckdb::string_t)>
              (left,right,result,fun);
    return;
  }
  if (((byte)VVar2 ^ 2) == 0 && VVar1 == (Vector)0x0) {
    ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::string_t(*)(duckdb::string_t,duckdb::string_t),false,true>
              (left,right,result,count,fun);
    return;
  }
  if (((byte)VVar1 ^ 2) == 0 && VVar2 == (Vector)0x0) {
    ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::string_t(*)(duckdb::string_t,duckdb::string_t),true,false>
              (left,right,result,count,fun);
    return;
  }
  if (VVar2 != (Vector)0x0 || VVar1 != (Vector)0x0) {
    ExecuteGeneric<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::string_t(*)(duckdb::string_t,duckdb::string_t)>
              (left,right,result,count,fun);
    return;
  }
  ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::string_t(*)(duckdb::string_t,duckdb::string_t),false,false>
            (left,right,result,count,fun);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}